

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O0

void mpp_enc_add_sw_header(MppEncImpl *enc,HalEncTask *hal_task)

{
  RK_S32 RVar1;
  RK_S32 local_54;
  RK_S32 local_50;
  RK_S32 length_1;
  RK_S32 length;
  RK_U32 add_header;
  MppFrame frame;
  MppPacket packet;
  EncFrmStatus *frm;
  EncRcTask *rc_task;
  MppEncHeaderStatus *hdr_status;
  EncImpl impl;
  HalEncTask *hal_task_local;
  MppEncImpl *enc_local;
  
  hdr_status = (MppEncHeaderStatus *)enc->impl;
  rc_task = (EncRcTask *)&enc->hdr_status;
  frm = (EncFrmStatus *)hal_task->rc_task;
  packet = frm + 0x13;
  frame = hal_task->packet;
  _length = hal_task->frame;
  impl = hal_task;
  hal_task_local = (HalEncTask *)enc;
  if ((*(uint *)rc_task & 0xe) == 0) {
    length_1 = 0;
    if ((enc->hdr_mode == MPP_ENC_HEADER_MODE_EACH_IDR) && ((*packet >> 4 & 1) != 0)) {
      length_1 = 1;
    }
    if ((((enc->cfg).rc.refresh_en != 0) && ((*packet >> 0x27 & 1) != 0)) &&
       ((*packet >> 5 & 1) == 0)) {
      length_1 = length_1 | 2;
    }
    if (length_1 != 0) {
      if ((mpp_enc_debug & 0x20) != 0) {
        _mpp_log_l(4,"mpp_enc","task %d IDR header length %d\n","mpp_enc_add_sw_header",
                   *packet >> 0x30);
      }
      mpp_packet_append(frame,*(MppPacket *)&hal_task_local[2].segment_nb);
      *(undefined4 *)((long)impl + 0x48) = *(undefined4 *)&hal_task_local[2].input;
      *(int *)((long)impl + 0x54) = *(int *)&hal_task_local[2].input + *(int *)((long)impl + 0x54);
      *(byte *)&(rc_task->cpb).seq_idx = (byte)(rc_task->cpb).seq_idx & 0xfb | 4;
    }
    if (((length_1 & 2U) != 0) && (0 < *(int *)((long)&hal_task_local[2].stopwatch + 4))) {
      local_50 = 0;
      enc_impl_add_prefix(hdr_status,frame,&local_50,uuid_refresh_cfg,&hal_task_local[5].flags,0);
      if (local_50 != 0) {
        if ((mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","task %d refresh header length %d\n","mpp_enc_add_sw_header",
                     *packet >> 0x30,(ulong)*(uint *)&hal_task_local[2].input);
        }
        *(RK_S32 *)((long)impl + 0x4c) = local_50 + *(int *)((long)impl + 0x4c);
        *(RK_S32 *)((long)impl + 0x54) = local_50 + *(int *)((long)impl + 0x54);
      }
    }
  }
  check_hal_task_pkt_len((HalEncTask *)impl,"header adding");
  if (((*packet >> 5 & 1) != 0) && (0 < *(int *)((long)&hal_task_local[2].stopwatch + 4))) {
    local_54 = 0;
    enc_impl_add_prefix(hdr_status,frame,&local_54,uuid_version,hal_task_local[2].md_info,
                        hal_task_local[2].part_first);
    *(RK_S32 *)((long)impl + 0x4c) = local_54 + *(int *)((long)impl + 0x4c);
    *(RK_S32 *)((long)impl + 0x54) = local_54 + *(int *)((long)impl + 0x54);
    local_54 = 0;
    enc_impl_add_prefix(hdr_status,frame,&local_54,uuid_rc_cfg,
                        *(void **)&hal_task_local[2].part_count,
                        *(RK_S32 *)((long)&hal_task_local[2].part_pos + 4));
    *(RK_S32 *)((long)impl + 0x4c) = local_54 + *(int *)((long)impl + 0x4c);
    *(RK_S32 *)((long)impl + 0x54) = local_54 + *(int *)((long)impl + 0x54);
  }
  RVar1 = mpp_frame_has_meta(_length);
  if (RVar1 != 0) {
    update_user_datas(hdr_status,frame,_length,(HalEncTask *)impl);
  }
  check_hal_task_pkt_len((HalEncTask *)impl,"user data adding");
  return;
}

Assistant:

static void mpp_enc_add_sw_header(MppEncImpl *enc, HalEncTask *hal_task)
{
    EncImpl impl = enc->impl;
    MppEncHeaderStatus *hdr_status = &enc->hdr_status;
    EncRcTask *rc_task = hal_task->rc_task;
    EncFrmStatus *frm = &rc_task->frm;
    MppPacket packet = hal_task->packet;
    MppFrame frame = hal_task->frame;

    if (!(hdr_status->val & HDR_ADDED_MASK)) {
        RK_U32 add_header = 0;

        if (enc->hdr_mode == MPP_ENC_HEADER_MODE_EACH_IDR && frm->is_intra)
            add_header |= 1;

        if (enc->cfg.rc.refresh_en && frm->is_i_recovery && !frm->is_idr)
            add_header |= 2;

        if (add_header) {
            enc_dbg_detail("task %d IDR header length %d\n",
                           frm->seq_idx, enc->hdr_len);

            mpp_packet_append(packet, enc->hdr_pkt);

            hal_task->header_length = enc->hdr_len;
            hal_task->length += enc->hdr_len;
            hdr_status->added_by_mode = 1;
        }

        if ((add_header & 2) && enc->sei_mode >= MPP_ENC_SEI_MODE_ONE_SEQ) {
            RK_S32 length = 0;

            enc_impl_add_prefix(impl, packet, &length, uuid_refresh_cfg,
                                &enc->cfg.rc.refresh_length, 0);

            if (length) {
                enc_dbg_detail("task %d refresh header length %d\n",
                               frm->seq_idx, enc->hdr_len);

                hal_task->sei_length += length;
                hal_task->length += length;
            }
        }
    }

    // check for header adding
    check_hal_task_pkt_len(hal_task, "header adding");

    /* 17. Add all prefix info before encoding */
    if (frm->is_idr && enc->sei_mode >= MPP_ENC_SEI_MODE_ONE_SEQ) {
        RK_S32 length = 0;

        enc_impl_add_prefix(impl, packet, &length, uuid_version,
                            enc->version_info, enc->version_length);

        hal_task->sei_length += length;
        hal_task->length += length;

        length = 0;
        enc_impl_add_prefix(impl, packet, &length, uuid_rc_cfg,
                            enc->rc_cfg_info, enc->rc_cfg_length);

        hal_task->sei_length += length;
        hal_task->length += length;
    }

    if (mpp_frame_has_meta(frame)) {
        update_user_datas(impl, packet, frame, hal_task);
    }

    // check for user data adding
    check_hal_task_pkt_len(hal_task, "user data adding");
}